

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall
QDockWidgetGroupWindow::hover(QDockWidgetGroupWindow *this,QLayoutItem *widgetItem,QPoint *mousePos)

{
  QArrayDataPointer<int> *this_00;
  QSize QVar1;
  bool bVar2;
  compare_eq_result_container<QList<int>,_int> cVar3;
  DockOptions DVar4;
  int iVar5;
  QLayout *pQVar6;
  QLayout *pQVar7;
  undefined4 extraout_var;
  QDockWidgetGroupWindow *this_01;
  QDockAreaLayoutInfo *pQVar8;
  QSize QVar9;
  iterator iVar10;
  TabMode tabMode;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo newState;
  QDockAreaLayoutItem local_68;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QWidget::layout((QWidget *)this);
  pQVar8 = (QDockAreaLayoutInfo *)(pQVar6 + 8);
  bVar2 = QDockAreaLayoutInfo::isEmpty(pQVar8);
  if (bVar2) {
    pQVar7 = QWidget::layout((QWidget *)this);
    QDockAreaLayoutInfo::operator=(pQVar8,(QDockAreaLayoutInfo *)&pQVar7[4].super_QLayoutItem);
  }
  DVar4 = QMainWindow::dockOptions(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
  newState.tabBar = (QTabBar *)&DAT_aaaaaaaaaaaaaaaa;
  newState._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  newState.item_list.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  newState._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
  newState.item_list.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  newState.item_list.d.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  newState.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  newState.mainWindow = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
  newState._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  newState.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  newState.separatorWidgets.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  newState.separatorWidgets.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  newState.sep = (int *)&DAT_aaaaaaaaaaaaaaaa;
  newState.separatorWidgets.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(&newState,pQVar8);
  tabMode = ForceTabs -
            (((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 8) == 0);
  if (((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
             super_QFlagsStorage<QMainWindow::DockOption>.i & 2) == 0) {
    tabMode = ForceTabs;
  }
  iVar5 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  this_01 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                      ((QObject *)CONCAT44(extraout_var,iVar5));
  if (this_01 != (QDockWidgetGroupWindow *)0x0) {
    pQVar8 = tabLayoutInfo((QDockWidgetGroupWindow *)this_01);
    if (pQVar8 == (QDockAreaLayoutInfo *)0x0) {
      tabMode = NoTabs;
    }
  }
  if (newState.tabbed == true) {
    pQVar8 = (QDockAreaLayoutInfo *)operator_new(0x70);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo(pQVar8,&newState);
    QDockAreaLayoutItem::QDockAreaLayoutItem(&local_68,pQVar8);
    QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
              (&newState.item_list.d,&local_68,local_40);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_68);
    iVar5 = *(int *)&pQVar6[9].field_0x4;
    QVar9 = QRect::size((QRect *)&pQVar6[9].field_0x8);
    QVar1 = (QSize)((ulong)QVar9 >> 0x20);
    if (iVar5 == 1) {
      QVar1 = QVar9;
    }
    iVar10 = QList<QDockAreaLayoutItem>::begin(&newState.item_list);
    (iVar10.i)->size = QVar1.wd.m_i.m_i;
    newState._88_8_ = newState._88_8_ & 0xffffffffffffff00;
    newState.tabBar = (QTabBar *)0x0;
  }
  local_68.placeHolderItem = (QPlaceHolderItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.widgetItem = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.subinfo = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::gapIndex
            ((QList<int> *)&local_68,&newState,mousePos,
             ((uint)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 10) == 2,tabMode);
  this_00 = (QArrayDataPointer<int> *)(this + 0x38);
  cVar3 = QList<int>::operator==((QList<int> *)&local_68,(QList<int> *)this_00);
  if (!cVar3) {
    bVar2 = QDockAreaLayoutInfo::hasGapItem(&newState,(QList<int> *)&local_68);
    if (!bVar2) {
      QArrayDataPointer<int>::operator=(this_00,(QArrayDataPointer<int> *)&local_68);
      QDockAreaLayoutInfo::insertGap(&newState,(QList<int> *)this_00,widgetItem);
      QDockAreaLayoutInfo::fitItems(&newState);
      pQVar6 = QWidget::layout((QWidget *)this);
      QDockAreaLayoutInfo::operator=((QDockAreaLayoutInfo *)&pQVar6[4].super_QLayoutItem,&newState);
      updateCurrentGapRect(this);
      pQVar6 = QWidget::layout((QWidget *)this);
      QDockAreaLayoutInfo::apply
                ((QDockAreaLayoutInfo *)&pQVar6[4].super_QLayoutItem,
                 (bool)((byte)DVar4.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                              super_QFlagsStorage<QMainWindow::DockOption>.i & 1));
      bVar2 = true;
      goto LAB_003ff2a6;
    }
  }
  bVar2 = false;
LAB_003ff2a6:
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_68);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&newState);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetGroupWindow::hover(QLayoutItem *widgetItem, const QPoint &mousePos)
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (savedState.isEmpty())
        savedState = *layoutInfo();

    QMainWindow::DockOptions opts = static_cast<QMainWindow *>(parentWidget())->dockOptions();
    QDockAreaLayoutInfo newState = savedState;
    bool nestingEnabled =
        (opts & QMainWindow::AllowNestedDocks) && !(opts & QMainWindow::ForceTabbedDocks);
    QDockAreaLayoutInfo::TabMode tabMode =
#if !QT_CONFIG(tabbar)
        QDockAreaLayoutInfo::NoTabs;
#else
        nestingEnabled ? QDockAreaLayoutInfo::AllowTabs : QDockAreaLayoutInfo::ForceTabs;
    if (auto group = qobject_cast<QDockWidgetGroupWindow *>(widgetItem->widget())) {
        if (!group->tabLayoutInfo())
            tabMode = QDockAreaLayoutInfo::NoTabs;
    }
    if (newState.tabbed) {
        // insertion into a top-level tab
        newState.item_list = { QDockAreaLayoutItem(new QDockAreaLayoutInfo(newState)) };
        newState.item_list.first().size = pick(savedState.o, savedState.rect.size());
        newState.tabbed = false;
        newState.tabBar = nullptr;
    }
#endif

    auto newGapPos = newState.gapIndex(mousePos, nestingEnabled, tabMode);
    Q_ASSERT(!newGapPos.isEmpty());

    // Do not insert a new gap item, if the current position already is a gap,
    // or if the group window contains one
    if (newGapPos == currentGapPos || newState.hasGapItem(newGapPos))
        return false;

    currentGapPos = newGapPos;
    newState.insertGap(currentGapPos, widgetItem);
    newState.fitItems();
    *layoutInfo() = std::move(newState);
    updateCurrentGapRect();
    layoutInfo()->apply(opts & QMainWindow::AnimatedDocks);
    return true;
}